

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
* __thiscall
despot::Parser::ComputeTopTransitions
          (vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
           *__return_storage_ptr__,Parser *this,vector<int,_std::allocator<int>_> *state,
          ACT_TYPE action,int num)

{
  value_type vVar1;
  pointer piVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  const_reference ppCVar10;
  undefined4 extraout_var;
  reference __x;
  reference __x_00;
  reference pvVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  __normal_iterator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_*,_std::vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>_>
  local_150;
  __normal_iterator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_*,_std::vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>_>
  local_148;
  const_iterator local_140;
  int local_134;
  undefined1 local_130 [4];
  int k;
  pair<std::vector<int,_std::allocator<int>_>,_double> next;
  vector<int,_std::allocator<int>_> state_1;
  double prob_1;
  pair<int,_double> *it2;
  int j;
  pair<std::vector<int,_std::allocator<int>_>,_double> *it1;
  undefined1 local_d0 [4];
  int i;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  tmp;
  double local_a8;
  double prob;
  int v;
  int pid;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> distribution;
  int s_1;
  double local_70;
  vector<int,_std::allocator<int>_> local_68;
  pair<std::vector<int,_std::allocator<int>_>,_double> local_50;
  undefined1 local_2d;
  int local_2c;
  int local_28;
  int s;
  int num_local;
  ACT_TYPE action_local;
  vector<int,_std::allocator<int>_> *state_local;
  Parser *this_local;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  *best;
  
  local_28 = num;
  s = action;
  _num_local = state;
  state_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (Parser *)__return_storage_ptr__;
  for (local_2c = 0; uVar5 = (ulong)local_2c,
      sVar6 = std::vector<int,_std::allocator<int>_>::size(_num_local), iVar4 = s, uVar5 < sVar6;
      local_2c = local_2c + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_num_local,(long)local_2c);
    vVar1 = *pvVar7;
    pvVar8 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->prev_state_vars_,(long)local_2c);
    (pvVar8->super_NamedVar).super_Variable.curr_value = vVar1;
  }
  pvVar9 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                     (&this->action_vars_,0);
  (pvVar9->super_Variable).curr_value = iVar4;
  local_2d = 0;
  std::
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  ::vector(__return_storage_ptr__);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_68);
  local_70 = 1.0;
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::
  pair<std::vector<int,_std::allocator<int>_>,_double,_true>(&local_50,&local_68,&local_70);
  std::
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  ::push_back(__return_storage_ptr__,&local_50);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair(&local_50);
  std::vector<int,_std::allocator<int>_>::~vector(&local_68);
  for (distribution.
       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      uVar5 = (ulong)(int)distribution.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
      sVar6 = std::vector<int,_std::allocator<int>_>::size(_num_local), uVar5 < sVar6;
      distribution.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)distribution.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&v);
    ppCVar10 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::operator[]
                         (&this->transition_funcs_,
                          (long)(int)distribution.
                                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar4 = (*((*ppCVar10)->super_Function)._vptr_Function[6])();
    prob._4_4_ = Variable::ComputeCurrentIndex
                           ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
                            CONCAT44(extraout_var,iVar4));
    prob._0_4_ = 0;
    while( true ) {
      uVar3 = prob._0_4_;
      pvVar8 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                         (&this->prev_state_vars_,
                          (long)(int)distribution.
                                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar4 = Variable::Size((Variable *)pvVar8);
      if (iVar4 <= (int)uVar3) break;
      ppCVar10 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::operator[]
                           (&this->transition_funcs_,
                            (long)(int)distribution.
                                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (*((*ppCVar10)->super_Function)._vptr_Function[4])
                (*ppCVar10,(ulong)prob._4_4_,(ulong)prob._0_4_);
      if (0.0 < (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) {
        std::pair<int,_double>::pair<int_&,_double_&,_true>
                  ((pair<int,_double> *)
                   &tmp.
                    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(int *)&prob,&local_a8);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&v,
                   (value_type *)
                   &tmp.
                    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      prob._0_4_ = prob._0_4_ + 1;
    }
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
    ::vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
              *)local_d0);
    for (it1._4_4_ = 0;
        sVar6 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                ::size(__return_storage_ptr__), (ulong)(long)it1._4_4_ < sVar6;
        it1._4_4_ = it1._4_4_ + 1) {
      __x = std::
            vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
            ::operator[](__return_storage_ptr__,(long)it1._4_4_);
      for (it2._4_4_ = 0;
          sVar6 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &v), (ulong)(long)it2._4_4_ < sVar6; it2._4_4_ = it2._4_4_ + 1) {
        __x_00 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)&v,(long)it2._4_4_);
        state_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)(__x->second * __x_00->second);
        sVar6 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                ::size((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                        *)local_d0);
        piVar2 = state_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if ((sVar6 != (long)local_28) ||
           (pvVar11 = std::
                      vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ::back((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                              *)local_d0), pvVar11->second <= (double)piVar2)) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&next.second,&__x->first);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&next.second,&__x_00->first);
          std::pair<std::vector<int,_std::allocator<int>_>,_double>::
          pair<std::vector<int,_std::allocator<int>_>_&,_double_&,_true>
                    ((pair<std::vector<int,_std::allocator<int>_>,_double> *)local_130,
                     (vector<int,_std::allocator<int>_> *)&next.second,
                     (double *)
                     &state_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          local_134 = 0;
          while ((uVar5 = (ulong)local_134,
                 sVar6 = std::
                         vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                         ::size((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                 *)local_d0), uVar5 < sVar6 &&
                 (pvVar11 = std::
                            vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                            ::operator[]((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                          *)local_d0,(long)local_134),
                 (double)next.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage <= pvVar11->second))) {
            local_134 = local_134 + 1;
          }
          local_150._M_current =
               (pair<std::vector<int,_std::allocator<int>_>,_double> *)
               std::
               vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ::begin((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                        *)local_d0);
          local_148 = __gnu_cxx::
                      __normal_iterator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_*,_std::vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>_>
                      ::operator+(&local_150,(long)local_134);
          __gnu_cxx::
          __normal_iterator<std::pair<std::vector<int,std::allocator<int>>,double>const*,std::vector<std::pair<std::vector<int,std::allocator<int>>,double>,std::allocator<std::pair<std::vector<int,std::allocator<int>>,double>>>>
          ::__normal_iterator<std::pair<std::vector<int,std::allocator<int>>,double>*>
                    ((__normal_iterator<std::pair<std::vector<int,std::allocator<int>>,double>const*,std::vector<std::pair<std::vector<int,std::allocator<int>>,double>,std::allocator<std::pair<std::vector<int,std::allocator<int>>,double>>>>
                      *)&local_140,&local_148);
          std::
          vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
          ::insert((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                    *)local_d0,local_140,(value_type *)local_130);
          if ((local_28 != -1) &&
             (sVar6 = std::
                      vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ::size((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                              *)local_d0), (ulong)(long)local_28 < sVar6)) {
            std::
            vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
            ::resize((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      *)local_d0,(long)local_28);
          }
          std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
                    ((pair<std::vector<int,_std::allocator<int>_>,_double> *)local_130);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)&next.second);
        }
      }
    }
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
    ::operator=(__return_storage_ptr__,
                (vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                 *)local_d0);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
    ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               *)local_d0);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&v);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<pair<vector<int>, double> > Parser::ComputeTopTransitions(
	const vector<int>& state, ACT_TYPE action, int num) const {
	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	vector<pair<vector<int>, double> > best;
	best.push_back(pair<vector<int>, double>(vector<int>(), 1.0));
	for (int s = 0; s < state.size(); s++) {
		// Compute sparse next state distribution
		vector<pair<int, double> > distribution;
		int pid = Variable::ComputeCurrentIndex(
			transition_funcs_[s]->parents());
		for (int v = 0; v < prev_state_vars_[s].Size(); v++) {
			double prob = transition_funcs_[s]->GetValue(pid, v);
			if (prob > 0)
				distribution.push_back(pair<int, double>(v, prob));
		}

		// Extend current best state vectors and keep the best
		vector<pair<vector<int>, double> > tmp;
		for (int i = 0; i < best.size(); i++) {
			const pair<vector<int>, double>& it1 = best[i];
			for (int j = 0; j < distribution.size(); j++) {
				const pair<int, double>& it2 = distribution[j];

				// Extend
				double prob = it1.second * it2.second;

				if (tmp.size() == num && prob < tmp.back().second)
					continue;

				vector<int> state = it1.first;
				state.push_back(it2.first);
				pair<vector<int>, double> next(state, prob);

				// Insert in descending order
				int k = 0;
				for (; k < tmp.size(); k++) {
					if (tmp[k].second < next.second)
						break;
				}
				tmp.insert(tmp.begin() + k, next);

				// Keep the best
				if (num != -1 && tmp.size() > num)
					tmp.resize(num);
			}
		}

		best = tmp;
	}
	return best;
}